

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDGAssemblyAnnotationWriter.h
# Opt level: O1

void __thiscall
dg::debug::LLVMDGAssemblyAnnotationWriter::emitBasicBlockStartAnnot
          (LLVMDGAssemblyAnnotationWriter *this,BasicBlock *B,formatted_raw_ostream *os)

{
  void *pvVar1;
  long lVar2;
  _Base_ptr *pp_Var3;
  raw_ostream *prVar4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  StringRef Str_06;
  
  if (this->opts != 0) {
    lVar2 = dg::getConstructedFunctions();
    for (p_Var6 = *(_Rb_tree_node_base **)(lVar2 + 0x18);
        p_Var6 != (_Rb_tree_node_base *)(lVar2 + 8);
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      pp_Var3 = &p_Var6[1]._M_parent[3]._M_parent;
      p_Var7 = (_Base_ptr)pp_Var3;
      for (p_Var8 = p_Var6[1]._M_parent[3]._M_left; p_Var8 != (_Base_ptr)0x0;
          p_Var8 = (&p_Var8->_M_left)[*(BasicBlock **)(p_Var8 + 1) < B]) {
        if (*(BasicBlock **)(p_Var8 + 1) >= B) {
          p_Var7 = p_Var8;
        }
      }
      p_Var8 = (_Base_ptr)pp_Var3;
      if ((p_Var7 != (_Base_ptr)pp_Var3) && (p_Var8 = p_Var7, B < *(BasicBlock **)(p_Var7 + 1))) {
        p_Var8 = (_Base_ptr)pp_Var3;
      }
      if (p_Var8 != (_Base_ptr)pp_Var3) {
        p_Var8 = p_Var8[1]._M_parent;
        if ((this->opts & (ANNOTATE_POSTDOM|ANNOTATE_CD)) != 0) {
          Str.Length = 8;
          Str.Data = "  ; BB: ";
          prVar4 = llvm::raw_ostream::operator<<((raw_ostream *)os,Str);
          prVar4 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar4,p_Var8);
          Str_00.Length = 1;
          Str_00.Data = "\n";
          llvm::raw_ostream::operator<<(prVar4,Str_00);
        }
        if ((this->opts & ANNOTATE_POSTDOM) != 0) {
          for (p_Var5 = *(_Rb_tree_node_base **)(p_Var8 + 8);
              p_Var5 != (_Rb_tree_node_base *)&p_Var8[7]._M_left;
              p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
            pvVar1 = *(void **)(p_Var5 + 1);
            Str_01.Length = 9;
            Str_01.Data = "  ; PDF: ";
            prVar4 = llvm::raw_ostream::operator<<((raw_ostream *)os,Str_01);
            prVar4 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar4,pvVar1);
            Str_02.Length = 1;
            Str_02.Data = "\n";
            llvm::raw_ostream::operator<<(prVar4,Str_02);
          }
          p_Var7 = p_Var8[8]._M_right;
          if ((p_Var7 != (_Base_ptr)0x0) && (*(long *)p_Var7 != 0)) {
            Str_03.Length = 9;
            Str_03.Data = "  ; iPD: ";
            prVar4 = llvm::raw_ostream::operator<<((raw_ostream *)os,Str_03);
            prVar4 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar4,p_Var7);
            Str_04.Length = 1;
            Str_04.Data = "\n";
            llvm::raw_ostream::operator<<(prVar4,Str_04);
          }
        }
        if ((this->opts & ANNOTATE_CD) != 0) {
          for (p_Var5 = *(_Rb_tree_node_base **)(p_Var8 + 5);
              p_Var5 != (_Rb_tree_node_base *)&p_Var8[4]._M_left;
              p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
            pvVar1 = *(void **)(p_Var5 + 1);
            Str_05.Length = 8;
            Str_05.Data = "  ; CD: ";
            prVar4 = llvm::raw_ostream::operator<<((raw_ostream *)os,Str_05);
            prVar4 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar4,pvVar1);
            Str_06.Length = 1;
            Str_06.Data = "\n";
            llvm::raw_ostream::operator<<(prVar4,Str_06);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void emitBasicBlockStartAnnot(const llvm::BasicBlock *B,
                                  llvm::formatted_raw_ostream &os) override {
        if (opts == 0)
            return;

        for (const auto &it : getConstructedFunctions()) {
            LLVMDependenceGraph *sub = it.second;
            auto &cb = sub->getBlocks();
            auto I = cb.find(const_cast<llvm::BasicBlock *>(B));
            if (I != cb.end()) {
                LLVMBBlock *BB = I->second;
                if (opts & (ANNOTATE_POSTDOM | ANNOTATE_CD))
                    os << "  ; BB: " << BB << "\n";

                if (opts & ANNOTATE_POSTDOM) {
                    for (LLVMBBlock *p : BB->getPostDomFrontiers())
                        os << "  ; PDF: " << p << "\n";

                    LLVMBBlock *P = BB->getIPostDom();
                    if (P && P->getKey())
                        os << "  ; iPD: " << P << "\n";
                }

                if (opts & ANNOTATE_CD) {
                    for (LLVMBBlock *p : BB->controlDependence())
                        os << "  ; CD: " << p << "\n";
                }
            }
        }
    }